

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::WeightParams::MergeFrom(WeightParams *this,WeightParams *from)

{
  bool bVar1;
  LogMessage *other;
  ulong uVar2;
  WeightParams *pWVar3;
  Arena *pAVar4;
  string *psVar5;
  QuantizationParams *this_00;
  QuantizationParams *from_00;
  LogFinisher local_95;
  uint32_t cached_has_bits;
  byte local_81;
  LogMessage local_80;
  WeightParams *local_48;
  WeightParams *from_local;
  WeightParams *this_local;
  WeightParams *local_30;
  string *local_28;
  WeightParams *local_20;
  string *local_18;
  WeightParams *local_10;
  
  local_81 = 0;
  local_48 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x57a0);
    local_81 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_80,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_95,other);
  }
  if ((local_81 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_80);
  }
  google::protobuf::RepeatedField<float>::MergeFrom(&this->floatvalue_,&local_48->floatvalue_);
  _internal_float16value_abi_cxx11_(local_48);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pWVar3 = (WeightParams *)_internal_float16value_abi_cxx11_(local_48);
    this_local = pWVar3;
    local_30 = this;
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->float16value_,pWVar3,pAVar4);
  }
  _internal_rawvalue_abi_cxx11_(local_48);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    psVar5 = _internal_rawvalue_abi_cxx11_(local_48);
    local_28 = psVar5;
    local_20 = this;
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->rawvalue_,psVar5,pAVar4);
  }
  _internal_int8rawvalue_abi_cxx11_(local_48);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    psVar5 = _internal_int8rawvalue_abi_cxx11_(local_48);
    local_18 = psVar5;
    local_10 = this;
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->int8rawvalue_,psVar5,pAVar4);
  }
  bVar1 = _internal_has_quantization(local_48);
  if (bVar1) {
    this_00 = _internal_mutable_quantization(this);
    from_00 = _internal_quantization(local_48);
    QuantizationParams::MergeFrom(this_00,from_00);
  }
  bVar1 = _internal_isupdatable(local_48);
  if (bVar1) {
    bVar1 = _internal_isupdatable(local_48);
    _internal_set_isupdatable(this,bVar1);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_48->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void WeightParams::MergeFrom(const WeightParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.WeightParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  floatvalue_.MergeFrom(from.floatvalue_);
  if (!from._internal_float16value().empty()) {
    _internal_set_float16value(from._internal_float16value());
  }
  if (!from._internal_rawvalue().empty()) {
    _internal_set_rawvalue(from._internal_rawvalue());
  }
  if (!from._internal_int8rawvalue().empty()) {
    _internal_set_int8rawvalue(from._internal_int8rawvalue());
  }
  if (from._internal_has_quantization()) {
    _internal_mutable_quantization()->::CoreML::Specification::QuantizationParams::MergeFrom(from._internal_quantization());
  }
  if (from._internal_isupdatable() != 0) {
    _internal_set_isupdatable(from._internal_isupdatable());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}